

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_printer.h
# Opt level: O2

void MyGame_Example_Monster_print_json_table
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td)

{
  flatcc_json_printer_struct_field(ctx,td,0,"pos",3,MyGame_Example_Vec3_print_json_struct);
  flatcc_json_printer_int16_field(ctx,td,1,"mana",4,0x96);
  flatcc_json_printer_int16_field(ctx,td,2,"hp",2,100);
  flatcc_json_printer_string_field(ctx,td,3,"name",4);
  flatcc_json_printer_uint8_vector_field(ctx,td,5,"inventory",9);
  flatcc_json_printer_int8_enum_field(ctx,td,6,"color",5,'\b',MyGame_Example_Color_print_json_enum);
  flatcc_json_printer_union_field
            (ctx,td,8,"test",4,MyGame_Example_Any_print_json_union_type,
             MyGame_Example_Any_print_json_union);
  flatcc_json_printer_struct_vector_field
            (ctx,td,9,"test4",5,4,MyGame_Example_Test_print_json_struct);
  flatcc_json_printer_string_vector_field(ctx,td,10,"testarrayofstring",0x11);
  flatcc_json_printer_table_vector_field
            (ctx,td,0xb,"testarrayoftables",0x11,MyGame_Example_Monster_print_json_table);
  flatcc_json_printer_table_field(ctx,td,0xc,"enemy",5,MyGame_Example_Monster_print_json_table);
  flatcc_json_printer_table_as_nested_root
            (ctx,td,0xd,"testnestedflatbuffer",0x14,(char *)0x0,
             MyGame_Example_Monster_print_json_table);
  flatcc_json_printer_table_field(ctx,td,0xe,"testempty",9,MyGame_Example_Stat_print_json_table);
  flatcc_json_printer_bool_field(ctx,td,0xf,"testbool",8,'\x01');
  flatcc_json_printer_int32_field(ctx,td,0x10,"testhashs32_fnv1",0x10,0);
  flatcc_json_printer_uint32_field(ctx,td,0x11,"testhashu32_fnv1",0x10,0);
  flatcc_json_printer_int64_field(ctx,td,0x12,"testhashs64_fnv1",0x10,0);
  flatcc_json_printer_uint64_field(ctx,td,0x13,"testhashu64_fnv1",0x10,0);
  flatcc_json_printer_int32_field(ctx,td,0x14,"testhashs32_fnv1a",0x11,0);
  flatcc_json_printer_uint32_field(ctx,td,0x15,"testhashu32_fnv1a",0x11,0);
  flatcc_json_printer_int64_field(ctx,td,0x16,"testhashs64_fnv1a",0x11,0);
  flatcc_json_printer_uint64_field(ctx,td,0x17,"testhashu64_fnv1a",0x11,0);
  flatcc_json_printer_bool_vector_field(ctx,td,0x18,"testarrayofbools",0x10);
  flatcc_json_printer_float_field(ctx,td,0x19,"testf",5,314159.0);
  flatcc_json_printer_float_field(ctx,td,0x1a,"testf2",6,3.0);
  flatcc_json_printer_float_field(ctx,td,0x1b,"testf3",6,0.0);
  flatcc_json_printer_string_vector_field(ctx,td,0x1c,"testarrayofstring2",0x12);
  flatcc_json_printer_struct_vector_field
            (ctx,td,0x1d,"testarrayofsortedstruct",0x17,8,MyGame_Example_Ability_print_json_struct);
  flatcc_json_printer_uint8_vector_field(ctx,td,0x1e,"flex",4);
  flatcc_json_printer_struct_vector_field
            (ctx,td,0x1f,"test5",5,4,MyGame_Example_Test_print_json_struct);
  flatcc_json_printer_int64_vector_field(ctx,td,0x20,"vector_of_longs",0xf);
  flatcc_json_printer_double_vector_field(ctx,td,0x21,"vector_of_doubles",0x11);
  flatcc_json_printer_table_field
            (ctx,td,0x22,"parent_namespace_test",0x15,MyGame_InParentNamespace_print_json_table);
  flatcc_json_printer_table_field
            (ctx,td,0x23,"testbase64",10,MyGame_Example_TestBase64_print_json_table);
  return;
}

Assistant:

static void MyGame_Example_Monster_print_json_table(flatcc_json_printer_t *ctx, flatcc_json_printer_table_descriptor_t *td)
{
    flatcc_json_printer_struct_field(ctx, td, 0, "pos", 3, MyGame_Example_Vec3_print_json_struct);
    flatcc_json_printer_int16_field(ctx, td, 1, "mana", 4, INT16_C(150));
    flatcc_json_printer_int16_field(ctx, td, 2, "hp", 2, INT16_C(100));
    flatcc_json_printer_string_field(ctx, td, 3, "name", 4);
    flatcc_json_printer_uint8_vector_field(ctx, td, 5, "inventory", 9);
    flatcc_json_printer_int8_enum_field(ctx, td, 6, "color", 5, INT8_C(8), MyGame_Example_Color_print_json_enum);
    flatcc_json_printer_union_field(ctx, td, 8, "test", 4, MyGame_Example_Any_print_json_union_type, MyGame_Example_Any_print_json_union);
    flatcc_json_printer_struct_vector_field(ctx, td, 9, "test4", 5, 4, MyGame_Example_Test_print_json_struct);
    flatcc_json_printer_string_vector_field(ctx, td, 10, "testarrayofstring", 17);
    flatcc_json_printer_table_vector_field(ctx, td, 11, "testarrayoftables", 17, MyGame_Example_Monster_print_json_table);
    flatcc_json_printer_table_field(ctx, td, 12, "enemy", 5, MyGame_Example_Monster_print_json_table);
    flatcc_json_printer_table_as_nested_root(ctx, td, 13, "testnestedflatbuffer", 20, 0, MyGame_Example_Monster_print_json_table);
    flatcc_json_printer_table_field(ctx, td, 14, "testempty", 9, MyGame_Example_Stat_print_json_table);
    flatcc_json_printer_bool_field(ctx, td, 15, "testbool", 8, UINT8_C(1));
    flatcc_json_printer_int32_field(ctx, td, 16, "testhashs32_fnv1", 16, INT32_C(0));
    flatcc_json_printer_uint32_field(ctx, td, 17, "testhashu32_fnv1", 16, UINT32_C(0));
    flatcc_json_printer_int64_field(ctx, td, 18, "testhashs64_fnv1", 16, INT64_C(0));
    flatcc_json_printer_uint64_field(ctx, td, 19, "testhashu64_fnv1", 16, UINT64_C(0));
    flatcc_json_printer_int32_field(ctx, td, 20, "testhashs32_fnv1a", 17, INT32_C(0));
    flatcc_json_printer_uint32_field(ctx, td, 21, "testhashu32_fnv1a", 17, UINT32_C(0));
    flatcc_json_printer_int64_field(ctx, td, 22, "testhashs64_fnv1a", 17, INT64_C(0));
    flatcc_json_printer_uint64_field(ctx, td, 23, "testhashu64_fnv1a", 17, UINT64_C(0));
    flatcc_json_printer_bool_vector_field(ctx, td, 24, "testarrayofbools", 16);
    flatcc_json_printer_float_field(ctx, td, 25, "testf", 5, 314159.000f);
    flatcc_json_printer_float_field(ctx, td, 26, "testf2", 6, 3.00000000f);
    flatcc_json_printer_float_field(ctx, td, 27, "testf3", 6, 0.00000000f);
    flatcc_json_printer_string_vector_field(ctx, td, 28, "testarrayofstring2", 18);
    flatcc_json_printer_struct_vector_field(ctx, td, 29, "testarrayofsortedstruct", 23, 8, MyGame_Example_Ability_print_json_struct);
    flatcc_json_printer_uint8_vector_field(ctx, td, 30, "flex", 4);
    flatcc_json_printer_struct_vector_field(ctx, td, 31, "test5", 5, 4, MyGame_Example_Test_print_json_struct);
    flatcc_json_printer_int64_vector_field(ctx, td, 32, "vector_of_longs", 15);
    flatcc_json_printer_double_vector_field(ctx, td, 33, "vector_of_doubles", 17);
    flatcc_json_printer_table_field(ctx, td, 34, "parent_namespace_test", 21, MyGame_InParentNamespace_print_json_table);
    flatcc_json_printer_table_field(ctx, td, 35, "testbase64", 10, MyGame_Example_TestBase64_print_json_table);
}